

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDiscreteDynamicsWorld.cpp
# Opt level: O2

void __thiscall
btDiscreteDynamicsWorld::integrateTransforms(btDiscreteDynamicsWorld *this,btScalar timeStep)

{
  btTransform *convexFromWorld;
  int iVar1;
  btPersistentManifold *pbVar2;
  bool bVar3;
  btRigidBody *this_00;
  long lVar4;
  btRigidBody *pbVar5;
  btVector3 *v;
  int p;
  long lVar6;
  btScalar bVar7;
  float fVar8;
  btVector3 bVar9;
  CProfileSample __profile_2;
  CProfileSample __profile;
  CProfileSample __profile_1;
  btVector3 imp;
  btTransform predictedTrans;
  btTransform modifiedPredictedTrans;
  btSphereShape tmpSphere;
  
  CProfileManager::Start_Profile("integrateTransforms");
  lVar4 = 0;
  do {
    if ((this->m_nonStaticRigidBodies).m_size <= lVar4) {
      if (this->m_applySpeculativeContactRestitution != false) {
        CProfileManager::Start_Profile("apply speculative contact restitution");
        for (lVar4 = 0; lVar4 < (this->m_predictiveManifolds).m_size; lVar4 = lVar4 + 1) {
          pbVar2 = (this->m_predictiveManifolds).m_data[lVar4];
          pbVar5 = (btRigidBody *)pbVar2->m_body0;
          this_00 = (btRigidBody *)pbVar2->m_body1;
          if (((pbVar5->super_btCollisionObject).m_internalType & 2) == 0) {
            pbVar5 = (btRigidBody *)0x0;
          }
          if (((this_00->super_btCollisionObject).m_internalType & 2) == 0) {
            this_00 = (btRigidBody *)0x0;
          }
          v = &pbVar2->m_pointCache[0].m_normalWorldOnB;
          for (lVar6 = 0; lVar6 < pbVar2->m_cachedPoints; lVar6 = lVar6 + 1) {
            bVar7 = btManifoldResult::calculateCombinedRestitution
                              (&pbVar5->super_btCollisionObject,&this_00->super_btCollisionObject);
            if ((0.0 < bVar7) &&
               ((*(btScalar *)((long)(v + 3) + 0xc) != 0.0 ||
                (NAN(*(btScalar *)((long)(v + 3) + 0xc)))))) {
              bVar9 = operator-(v);
              fVar8 = *(btScalar *)((long)(v + 3) + 0xc);
              imp.m_floats[1] = bVar7 * bVar9.m_floats[1] * fVar8;
              imp.m_floats[0] = bVar7 * bVar9.m_floats[0] * fVar8;
              imp.m_floats[2] = bVar9.m_floats[2] * fVar8 * bVar7;
              imp.m_floats[3] = 0.0;
              tmpSphere.super_btConvexInternalShape.super_btConvexShape.super_btCollisionShape.
              _0_16_ = operator-(v + -1,&(pbVar5->super_btCollisionObject).m_worldTransform.m_origin
                                );
              modifiedPredictedTrans.m_basis.m_el[0] =
                   operator-(v + -2,&(this_00->super_btCollisionObject).m_worldTransform.m_origin);
              btRigidBody::applyImpulse(pbVar5,&imp,(btVector3 *)&tmpSphere);
              unique0x100002aa = -imp.m_floats[2];
              ___profile_1 = imp.m_floats._0_8_ ^ 0x8000000080000000;
              unique0x100002ae = 0;
              btRigidBody::applyImpulse
                        (this_00,(btVector3 *)&__profile_1,(btVector3 *)&modifiedPredictedTrans);
            }
            v = v + 0xc;
          }
        }
        CProfileSample::~CProfileSample(&__profile_2);
      }
      CProfileSample::~CProfileSample(&__profile);
      return;
    }
    pbVar5 = (this->m_nonStaticRigidBodies).m_data[lVar4];
    (pbVar5->super_btCollisionObject).m_hitFraction = 1.0;
    iVar1 = (pbVar5->super_btCollisionObject).m_activationState1;
    if (((iVar1 != 2) && (iVar1 != 5)) &&
       (((pbVar5->super_btCollisionObject).m_collisionFlags & 3) == 0)) {
      btRigidBody::predictIntegratedTransform(pbVar5,timeStep,&predictedTrans);
      imp = operator-(&predictedTrans.m_origin,
                      &(pbVar5->super_btCollisionObject).m_worldTransform.m_origin);
      bVar7 = btVector3::length2(&imp);
      if ((this->super_btDynamicsWorld).super_btCollisionWorld.m_dispatchInfo.m_useContinuous ==
          true) {
        fVar8 = (pbVar5->super_btCollisionObject).m_ccdMotionThreshold;
        fVar8 = fVar8 * fVar8;
        if (((fVar8 != 0.0) || (NAN(fVar8))) && (fVar8 < bVar7)) {
          CProfileManager::Start_Profile("CCD motion clamping");
          if (((pbVar5->super_btCollisionObject).m_collisionShape)->m_shapeType < 0x14) {
            gNumClampedCcdMotions = gNumClampedCcdMotions + 1;
            (*((this->super_btDynamicsWorld).super_btCollisionWorld.m_broadphasePairCache)->
              _vptr_btBroadphaseInterface[9])();
            imp.m_floats[2] = 1.0;
            imp.m_floats[3] = -NAN;
            imp.m_floats._0_8_ = &PTR__ConvexResultCallback_001f1af0;
            btSphereShape::btSphereShape
                      (&tmpSphere,(pbVar5->super_btCollisionObject).m_ccdSweptSphereRadius);
            convexFromWorld = &(pbVar5->super_btCollisionObject).m_worldTransform;
            imp.m_floats[3] =
                 *(btScalar *)
                  &((pbVar5->super_btCollisionObject).m_broadphaseHandle)->m_collisionFilterGroup;
            modifiedPredictedTrans.m_origin.m_floats[0] = predictedTrans.m_origin.m_floats[0];
            modifiedPredictedTrans.m_origin.m_floats[1] = predictedTrans.m_origin.m_floats[1];
            modifiedPredictedTrans.m_origin.m_floats[2] = predictedTrans.m_origin.m_floats[2];
            modifiedPredictedTrans.m_origin.m_floats[3] = predictedTrans.m_origin.m_floats[3];
            modifiedPredictedTrans.m_basis.m_el[0].m_floats =
                 *&(convexFromWorld->m_basis).m_el[0].m_floats;
            modifiedPredictedTrans.m_basis.m_el[1].m_floats._0_8_ =
                 *(undefined8 *)
                  (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats;
            modifiedPredictedTrans.m_basis.m_el[1].m_floats._8_8_ =
                 *(undefined8 *)
                  ((pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats + 2);
            modifiedPredictedTrans.m_basis.m_el[2].m_floats._0_8_ =
                 *(undefined8 *)
                  (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats;
            modifiedPredictedTrans.m_basis.m_el[2].m_floats._8_8_ =
                 *(undefined8 *)
                  ((pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats + 2);
            btCollisionWorld::convexSweepTest
                      ((btCollisionWorld *)this,(btConvexShape *)&tmpSphere,convexFromWorld,
                       &modifiedPredictedTrans,(ConvexResultCallback *)&imp,0.0);
            bVar7 = imp.m_floats[2];
            bVar3 = imp.m_floats[2] < 1.0;
            if (bVar3) {
              (pbVar5->super_btCollisionObject).m_hitFraction = imp.m_floats[2];
              btRigidBody::predictIntegratedTransform
                        (pbVar5,imp.m_floats[2] * timeStep,&predictedTrans);
              (pbVar5->super_btCollisionObject).m_hitFraction = 0.0;
              btRigidBody::proceedToTransform(pbVar5,&predictedTrans);
            }
            btConvexShape::~btConvexShape((btConvexShape *)&tmpSphere);
            if (1.0 <= bVar7) goto LAB_0018070c;
          }
          else {
LAB_0018070c:
            bVar3 = false;
          }
          CProfileSample::~CProfileSample(&__profile_1);
          if (bVar3) goto LAB_00180727;
        }
      }
      btRigidBody::proceedToTransform(pbVar5,&predictedTrans);
    }
LAB_00180727:
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

void	btDiscreteDynamicsWorld::integrateTransforms(btScalar timeStep)
{
	BT_PROFILE("integrateTransforms");
	btTransform predictedTrans;
	for ( int i=0;i<m_nonStaticRigidBodies.size();i++)
	{
		btRigidBody* body = m_nonStaticRigidBodies[i];
		body->setHitFraction(1.f);

		if (body->isActive() && (!body->isStaticOrKinematicObject()))
		{

			body->predictIntegratedTransform(timeStep, predictedTrans);

			btScalar squareMotion = (predictedTrans.getOrigin()-body->getWorldTransform().getOrigin()).length2();



			if (getDispatchInfo().m_useContinuous && body->getCcdSquareMotionThreshold() && body->getCcdSquareMotionThreshold() < squareMotion)
			{
				BT_PROFILE("CCD motion clamping");
				if (body->getCollisionShape()->isConvex())
				{
					gNumClampedCcdMotions++;
#ifdef USE_STATIC_ONLY
					class StaticOnlyCallback : public btClosestNotMeConvexResultCallback
					{
					public:

						StaticOnlyCallback (btCollisionObject* me,const btVector3& fromA,const btVector3& toA,btOverlappingPairCache* pairCache,btDispatcher* dispatcher) :
						  btClosestNotMeConvexResultCallback(me,fromA,toA,pairCache,dispatcher)
						{
						}

					  	virtual bool needsCollision(btBroadphaseProxy* proxy0) const
						{
							btCollisionObject* otherObj = (btCollisionObject*) proxy0->m_clientObject;
							if (!otherObj->isStaticOrKinematicObject())
								return false;
							return btClosestNotMeConvexResultCallback::needsCollision(proxy0);
						}
					};

					StaticOnlyCallback sweepResults(body,body->getWorldTransform().getOrigin(),predictedTrans.getOrigin(),getBroadphase()->getOverlappingPairCache(),getDispatcher());
#else
					btClosestNotMeConvexResultCallback sweepResults(body,body->getWorldTransform().getOrigin(),predictedTrans.getOrigin(),getBroadphase()->getOverlappingPairCache(),getDispatcher());
#endif
					//btConvexShape* convexShape = static_cast<btConvexShape*>(body->getCollisionShape());
					btSphereShape tmpSphere(body->getCcdSweptSphereRadius());//btConvexShape* convexShape = static_cast<btConvexShape*>(body->getCollisionShape());
					sweepResults.m_allowedPenetration=getDispatchInfo().m_allowedCcdPenetration;

					sweepResults.m_collisionFilterGroup = body->getBroadphaseProxy()->m_collisionFilterGroup;
					sweepResults.m_collisionFilterMask  = body->getBroadphaseProxy()->m_collisionFilterMask;
					btTransform modifiedPredictedTrans = predictedTrans;
					modifiedPredictedTrans.setBasis(body->getWorldTransform().getBasis());

					convexSweepTest(&tmpSphere,body->getWorldTransform(),modifiedPredictedTrans,sweepResults);
					if (sweepResults.hasHit() && (sweepResults.m_closestHitFraction < 1.f))
					{

						//printf("clamped integration to hit fraction = %f\n",fraction);
						body->setHitFraction(sweepResults.m_closestHitFraction);
						body->predictIntegratedTransform(timeStep*body->getHitFraction(), predictedTrans);
						body->setHitFraction(0.f);
						body->proceedToTransform( predictedTrans);

#if 0
						btVector3 linVel = body->getLinearVelocity();

						btScalar maxSpeed = body->getCcdMotionThreshold()/getSolverInfo().m_timeStep;
						btScalar maxSpeedSqr = maxSpeed*maxSpeed;
						if (linVel.length2()>maxSpeedSqr)
						{
							linVel.normalize();
							linVel*= maxSpeed;
							body->setLinearVelocity(linVel);
							btScalar ms2 = body->getLinearVelocity().length2();
							body->predictIntegratedTransform(timeStep, predictedTrans);

							btScalar sm2 = (predictedTrans.getOrigin()-body->getWorldTransform().getOrigin()).length2();
							btScalar smt = body->getCcdSquareMotionThreshold();
							printf("sm2=%f\n",sm2);
						}
#else

						//don't apply the collision response right now, it will happen next frame
						//if you really need to, you can uncomment next 3 lines. Note that is uses zero restitution.
						//btScalar appliedImpulse = 0.f;
						//btScalar depth = 0.f;
						//appliedImpulse = resolveSingleCollision(body,(btCollisionObject*)sweepResults.m_hitCollisionObject,sweepResults.m_hitPointWorld,sweepResults.m_hitNormalWorld,getSolverInfo(), depth);


#endif

        				continue;
					}
				}
			}


			body->proceedToTransform( predictedTrans);

		}

	}

	///this should probably be switched on by default, but it is not well tested yet
	if (m_applySpeculativeContactRestitution)
	{
		BT_PROFILE("apply speculative contact restitution");
		for (int i=0;i<m_predictiveManifolds.size();i++)
		{
			btPersistentManifold* manifold = m_predictiveManifolds[i];
			btRigidBody* body0 = btRigidBody::upcast((btCollisionObject*)manifold->getBody0());
			btRigidBody* body1 = btRigidBody::upcast((btCollisionObject*)manifold->getBody1());

			for (int p=0;p<manifold->getNumContacts();p++)
			{
				const btManifoldPoint& pt = manifold->getContactPoint(p);
				btScalar combinedRestitution = btManifoldResult::calculateCombinedRestitution(body0, body1);

				if (combinedRestitution>0 && pt.m_appliedImpulse != 0.f)
				//if (pt.getDistance()>0 && combinedRestitution>0 && pt.m_appliedImpulse != 0.f)
				{
					btVector3 imp = -pt.m_normalWorldOnB * pt.m_appliedImpulse* combinedRestitution;

					const btVector3& pos1 = pt.getPositionWorldOnA();
					const btVector3& pos2 = pt.getPositionWorldOnB();

					btVector3 rel_pos0 = pos1 - body0->getWorldTransform().getOrigin();
					btVector3 rel_pos1 = pos2 - body1->getWorldTransform().getOrigin();

					if (body0)
						body0->applyImpulse(imp,rel_pos0);
					if (body1)
						body1->applyImpulse(-imp,rel_pos1);
				}
			}
		}
	}

}